

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_subnegotiation(telnet_t *telnet,int telopt,char *buffer,size_t size)

{
  telnet_error_t tVar1;
  undefined1 local_58 [8];
  telnet_event_t ev;
  uchar bytes [8];
  size_t size_local;
  char *buffer_local;
  int telopt_local;
  telnet_t *telnet_local;
  
  bytes = (uchar  [8])size;
  if (telopt < 0x200) {
    if (telopt < 0x100) {
      ev.error.line._0_1_ = 0xff;
      ev.error.line._1_1_ = 0xfa;
      ev.error.line._3_1_ = 0xff;
      ev.error.errcode._0_1_ = 0xf0;
      ev.error.line._2_1_ = (char)telopt;
      _send(telnet,(char *)&ev.error.line,3);
      telnet_send(telnet,buffer,(size_t)bytes);
      _send(telnet,(char *)((long)&ev.error.line + 3),2);
      if ((((telnet->flags & 1) != 0) && (telopt == 0x56)) &&
         (tVar1 = _init_zlib(telnet,1,1), tVar1 == TELNET_EOK)) {
        local_58._0_4_ = TELNET_EV_COMPRESS;
        local_58[4] = '\x01';
        (*telnet->eh)(telnet,(telnet_event_t *)local_58,telnet->ud);
      }
    }
    else {
      ev.error.line._0_1_ = 0xff;
      ev.error.line._1_1_ = 0xfa;
      ev.error.line._2_1_ = 0xff;
      ev.error.line._3_1_ = 0xfa;
      ev.error.errcode._1_1_ = 0xf0;
      ev.error.errcode._2_1_ = 0xff;
      ev.error.errcode._3_1_ = 0xf0;
      ev.error.errcode._0_1_ = (char)telopt;
      _send(telnet,(char *)&ev.error.line,5);
      telnet_send(telnet,buffer,(size_t)bytes);
      _send(telnet,(char *)((long)&ev.error.errcode + 1),3);
    }
  }
  else {
    _error(telnet,0x604,"telnet_subnegotiation",TELNET_EBADVAL,0,
           "supplied telopt %d for subnegotiation is greater than 511",telopt);
  }
  return;
}

Assistant:

void telnet_subnegotiation(telnet_t *telnet, int telopt,
		const char *buffer, size_t size) {
	unsigned char bytes[8];

	if (telopt > 511) {
		_error(telnet, __LINE__, __func__, TELNET_EBADVAL, 0,
				"supplied telopt %d for subnegotiation is greater than 511", telopt);
		return;
	}

	if (telopt > 255) {
		/* an EXOPL telopt */

		bytes[0] = TELNET_IAC;
		bytes[1] = TELNET_SB;
		bytes[2] = TELNET_TELOPT_EXOPL;
		bytes[3] = TELNET_SB;
		bytes[4] = (unsigned char)(telopt - 256);
		bytes[5] = TELNET_SE;
		bytes[6] = TELNET_IAC;
		bytes[7] = TELNET_SE;

		_sendu(telnet, bytes, 5);
		telnet_send(telnet, buffer, size);
		_sendu(telnet, bytes + 5, 3);

		return;
	}

	bytes[0] = TELNET_IAC;
	bytes[1] = TELNET_SB;
	bytes[2] = (unsigned char)telopt;
	bytes[3] = TELNET_IAC;
	bytes[4] = TELNET_SE;

	_sendu(telnet, bytes, 3);
	telnet_send(telnet, buffer, size);
	_sendu(telnet, bytes + 3, 2);

#if defined(HAVE_ZLIB)
	/* if we're a proxy and we just sent the COMPRESS2 marker, we must
	 * make sure all further data is compressed if not already.
	 */
	if (telnet->flags & TELNET_FLAG_PROXY &&
			telopt == TELNET_TELOPT_COMPRESS2) {
		telnet_event_t ev;

		if (_init_zlib(telnet, 1, 1) != TELNET_EOK)
			return;

		/* notify app that compression was enabled */
		ev.type = TELNET_EV_COMPRESS;
		ev.compress.state = 1;
		telnet->eh(telnet, &ev, telnet->ud);
	}
#endif /* defined(HAVE_ZLIB) */
}